

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

Instr * __thiscall Lowerer::LowerTrapIfUnalignedAccess(Lowerer *this,Instr *instr)

{
  int iVar1;
  code *pcVar2;
  bool bVar3;
  OpndKind OVar4;
  Opnd *dst;
  Opnd *src;
  undefined4 *puVar5;
  ulong uVar6;
  IntConstOpnd *pIVar7;
  RegOpnd *dstOpnd;
  Instr *instr_00;
  LabelInstr *branchTarget;
  BranchInstr *instr_01;
  LabelInstr *instr_02;
  Opnd *pOVar8;
  
  dst = IR::Instr::UnlinkDst(instr);
  src = IR::Instr::UnlinkSrc1(instr);
  pOVar8 = instr->m_src2;
  if (instr->m_opcode != TrapIfUnalignedAccess) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6a52,"(instr->m_opcode == Js::OpCode::TrapIfUnalignedAccess)",
                       "instr->m_opcode == Js::OpCode::TrapIfUnalignedAccess");
    if (!bVar3) goto LAB_005aee04;
    *puVar5 = 0;
  }
  if ((src == (Opnd *)0x0) || (src->m_type == TyVar)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6a53,"(src1 && !src1->IsVar())","src1 && !src1->IsVar()");
    if (!bVar3) goto LAB_005aee04;
    *puVar5 = 0;
  }
  if (pOVar8 == (Opnd *)0x0) {
LAB_005aec15:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6a54,"(src2 && src2->IsImmediateOpnd())","src2 && src2->IsImmediateOpnd()"
                      );
    if (!bVar3) goto LAB_005aee04;
    *puVar5 = 0;
  }
  else {
    OVar4 = IR::Opnd::GetKind(pOVar8);
    if (OVar4 != OpndKindIntConst) {
      OVar4 = IR::Opnd::GetKind(pOVar8);
      if (OVar4 != OpndKindInt64Const) {
        OVar4 = IR::Opnd::GetKind(pOVar8);
        if (OVar4 != OpndKindAddr) {
          OVar4 = IR::Opnd::GetKind(pOVar8);
          if (OVar4 != OpndKindHelperCall) goto LAB_005aec15;
        }
      }
    }
  }
  if (TySize[pOVar8->m_type] < 2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6a55,"(src2->GetSize() > 1)","src2->GetSize() > 1");
    if (!bVar3) {
LAB_005aee04:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  iVar1 = TySize[pOVar8->m_type];
  uVar6 = IR::Opnd::GetImmediateValue(pOVar8,this->m_func);
  InsertMove(dst,src,instr,true);
  pIVar7 = IR::IntConstOpnd::New((ulong)(iVar1 - 1),src->m_type,this->m_func,false);
  dstOpnd = IR::RegOpnd::New(src->m_type,this->m_func);
  instr_00 = IR::Instr::New(And_I4,&dstOpnd->super_Opnd,src,&pIVar7->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(instr,instr_00);
  pIVar7 = IR::IntConstOpnd::New(uVar6 & 0xffffffff,(dstOpnd->super_Opnd).m_type,this->m_func,true);
  branchTarget = IR::LabelInstr::New(Label,this->m_func,false);
  instr_01 = IR::BranchInstr::New
                       (BrEq_I4,branchTarget,&dstOpnd->super_Opnd,&pIVar7->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(instr,&instr_01->super_Instr);
  instr_02 = IR::LabelInstr::New(Label,instr->m_func,true);
  IR::Instr::InsertBefore(instr,&instr_02->super_Instr);
  pOVar8 = IR::IntConstOpnd::NewFromType(0x1b77,TyInt32,this->m_func);
  GenerateThrow(this,pOVar8,instr);
  IR::Instr::InsertBefore(instr,&branchTarget->super_Instr);
  IR::Instr::Remove(instr);
  return &instr_01->super_Instr;
}

Assistant:

IR::Instr*
Lowerer::LowerTrapIfUnalignedAccess(IR::Instr * const instr)
{
    IR::Opnd* dst = instr->UnlinkDst();
    IR::Opnd* src1 = instr->UnlinkSrc1();
    IR::Opnd* src2 = instr->GetSrc2();
    Assert(instr);
    Assert(instr->m_opcode == Js::OpCode::TrapIfUnalignedAccess);
    Assert(src1 && !src1->IsVar());
    Assert(src2 && src2->IsImmediateOpnd());
    Assert(src2->GetSize() > 1);

    uint32 mask = src2->GetSize() - 1;
    uint32 cmpValue = (uint32)src2->GetImmediateValue(m_func);

    InsertMove(dst, src1, instr);
    IR::IntConstOpnd* maskOpnd = IR::IntConstOpnd::New(mask, src1->GetType(), m_func);
    IR::RegOpnd* maskedOpnd = IR::RegOpnd::New(src1->GetType(), m_func);
    IR::Instr* maskInstr = IR::Instr::New(Js::OpCode::And_I4, maskedOpnd, src1, maskOpnd, m_func);
    instr->InsertBefore(maskInstr);

    IR::IntConstOpnd* cmpOpnd = IR::IntConstOpnd::New(cmpValue, maskedOpnd->GetType(), m_func, true);
    IR::LabelInstr* alignedLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func);
    IR::Instr* branch = IR::BranchInstr::New(Js::OpCode::BrEq_I4, alignedLabel, maskedOpnd, cmpOpnd, m_func);
    instr->InsertBefore(branch);
    InsertLabel(true, instr);
    GenerateThrow(IR::IntConstOpnd::NewFromType(SCODE_CODE(WASMERR_UnalignedAtomicAccess), TyInt32, m_func), instr);
    instr->InsertBefore(alignedLabel);

    instr->Remove();
    // The check and branch are not fully lowered yet, let them go in the lower loop.
    return branch;
}